

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

int get_sync_range(int width)

{
  int width_local;
  undefined4 local_4;
  
  if (width < 0x280) {
    local_4 = 1;
  }
  else if (width < 0x501) {
    local_4 = 2;
  }
  else if (width < 0x1001) {
    local_4 = 4;
  }
  else {
    local_4 = 8;
  }
  return local_4;
}

Assistant:

static inline int get_sync_range(int width) {
  // nsync numbers are picked by testing. For example, for 4k
  // video, using 4 gives best performance.
  if (width < 640)
    return 1;
  else if (width <= 1280)
    return 2;
  else if (width <= 4096)
    return 4;
  else
    return 8;
}